

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChStream.cpp
# Opt level: O1

ChStreamInBinary * __thiscall
chrono::ChStreamInBinary::operator>>(ChStreamInBinary *this,float *Val)

{
  undefined1 uVar1;
  undefined8 in_RAX;
  undefined1 *puVar2;
  long lVar3;
  float tmp;
  undefined4 local_14;
  
  local_14 = (float)((ulong)in_RAX >> 0x20);
  if ((this->super_ChBinaryArchive).big_endian_machine == true) {
    (*(this->super_ChStreamIn)._vptr_ChStreamIn[3])(this,&local_14,4);
    puVar2 = (undefined1 *)((long)&local_14 + 3);
    lVar3 = 0;
    do {
      uVar1 = *(undefined1 *)((long)&local_14 + lVar3);
      *(undefined1 *)((long)&local_14 + lVar3) = *puVar2;
      *puVar2 = uVar1;
      lVar3 = lVar3 + 1;
      puVar2 = puVar2 + -1;
    } while (lVar3 == 1);
    *Val = local_14;
  }
  else {
    (*(this->super_ChStreamIn)._vptr_ChStreamIn[3])(this,Val,4);
  }
  return this;
}

Assistant:

ChStreamInBinary& ChStreamInBinary::operator>>(float& Val) {
    if (big_endian_machine) {
        float tmp;
        this->Input((char*)&tmp, sizeof(float));
        StreamSwapBytes<float>(&tmp);
        Val = tmp;
    } else {
        this->Input((char*)&Val, sizeof(float));
    }
    return (*this);
}